

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.cc
# Opt level: O1

int des_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t in_len)

{
  DES_key_schedule *schedule;
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  uVar1 = (ulong)ctx->cipher->block_size;
  if (uVar1 <= in_len) {
    schedule = (DES_key_schedule *)ctx->cipher_data;
    uVar2 = 0;
    do {
      DES_ecb_encrypt_ex(in + uVar2,out + uVar2,schedule,ctx->encrypt);
      uVar2 = uVar2 + ctx->cipher->block_size;
    } while (uVar2 <= in_len - uVar1);
  }
  return 1;
}

Assistant:

static int des_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                          size_t in_len) {
  if (in_len < ctx->cipher->block_size) {
    return 1;
  }
  in_len -= ctx->cipher->block_size;

  EVP_DES_KEY *dat = (EVP_DES_KEY *)ctx->cipher_data;
  for (size_t i = 0; i <= in_len; i += ctx->cipher->block_size) {
    DES_ecb_encrypt_ex(in + i, out + i, &dat->ks.ks, ctx->encrypt);
  }
  return 1;
}